

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

void __thiscall
pbrt::Image::CopyRectOut(Image *this,Bounds2i *extent,span<float> buf,WrapMode2D wrapMode)

{
  ushort uVar1;
  int iVar2;
  PixelFormat PVar3;
  Half *pHVar4;
  float *pfVar5;
  Tuple2<pbrt::Point2,_int> TVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  int iVar10;
  size_t sVar11;
  Bounds2i *pBVar12;
  WrapMode WVar13;
  ulong uVar14;
  float *pfVar15;
  int iVar16;
  uint uVar17;
  float fVar18;
  int iVar19;
  uint uVar20;
  char *args;
  char *args_1;
  size_t sVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  span<float> vout;
  span<float> vout_00;
  span<float> vout_01;
  span<float> vout_02;
  span<float> vout_03;
  span<float> vout_04;
  span<const_unsigned_char> vin;
  span<const_unsigned_char> vin_00;
  span<const_unsigned_char> vin_01;
  span<const_unsigned_char> vin_02;
  span<const_unsigned_char> vin_03;
  span<const_unsigned_char> vin_04;
  int local_68;
  int vb;
  size_t va;
  int local_54;
  Bounds2i *local_50;
  int local_44;
  array<pbrt::WrapMode,_2> local_40;
  ulong local_38;
  
  uVar14 = buf.n;
  pfVar15 = buf.ptr;
  iVar19 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>.x;
  iVar2 = (extent->pMin).super_Tuple2<pbrt::Point2,_int>.x;
  uVar24 = (this->channelNames).nStored;
  local_68 = (extent->pMin).super_Tuple2<pbrt::Point2,_int>.y;
  iVar10 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>.y;
  local_54 = iVar19 - iVar2;
  iVar23 = (int)uVar24;
  iVar16 = local_54 * iVar23;
  vb = (iVar10 - local_68) * iVar16;
  va = uVar14;
  local_40 = wrapMode.wrap.values;
  if (uVar14 < (ulong)(long)vb) {
    LogFatal<char_const(&)[11],char_const(&)[28],char_const(&)[11],unsigned_long&,char_const(&)[28],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
               ,0x293,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [11])"buf.size()",
               (char (*) [28])"extent.Area() * NChannels()",(char (*) [11])"buf.size()",&va,
               (char (*) [28])"extent.Area() * NChannels()",&vb);
  }
  PVar3 = this->format;
  va._4_4_ = buf.n._4_4_;
  local_50 = extent;
  if (PVar3 == Float) {
    if (iVar19 <= iVar2) goto LAB_002af2d6;
    if (local_68 < iVar10) {
      TVar6 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
      uVar20 = TVar6.x;
      if ((int)((int)uVar20 >> 0x1f & uVar20) <= iVar2) {
        uVar17 = TVar6.y;
        if ((((int)((int)uVar17 >> 0x1f & uVar17) <= local_68) &&
            (iVar19 <= (int)(~((int)uVar20 >> 0x1f) & uVar20))) &&
           (iVar10 <= (int)(~((int)uVar17 >> 0x1f) & uVar17))) {
          do {
            if (0 < local_54) {
              pfVar5 = (this->p32).ptr;
              iVar16 = 0;
              iVar19 = (local_68 * uVar20 + iVar2) * iVar23;
              do {
                if (0 < iVar23) {
                  lVar22 = 0;
                  do {
                    lVar8 = iVar19 + lVar22;
                    lVar22 = lVar22 + 1;
                    *pfVar15 = pfVar5[lVar8];
                    pfVar15 = pfVar15 + 1;
                  } while (iVar23 != (int)lVar22);
                  iVar19 = iVar19 + (int)lVar22;
                }
                iVar16 = iVar16 + 1;
              } while (iVar16 != local_54);
            }
            local_68 = local_68 + 1;
          } while (local_68 != iVar10);
          return;
        }
      }
      vb = iVar10;
      do {
        if (0 < local_54) {
          iVar19 = 0;
          do {
            va = CONCAT44(local_68,(extent->pMin).super_Tuple2<pbrt::Point2,_int>.x + iVar19);
            bVar9 = RemapPixelCoords((Point2i *)&va,
                                     (Point2i)(this->resolution).super_Tuple2<pbrt::Point2,_int>,
                                     (WrapMode2D)local_40.values);
            if (!bVar9) goto LAB_002af276;
            if (0 < iVar23) {
              iVar10 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
              sVar21 = (this->channelNames).nStored;
              lVar22 = 0;
              pfVar5 = (this->p32).ptr;
              do {
                lVar8 = ((int)va + (int)(va >> 0x20) * iVar10) * (int)sVar21 + lVar22;
                lVar22 = lVar22 + 1;
                *pfVar15 = pfVar5[lVar8];
                pfVar15 = pfVar15 + 1;
              } while (iVar23 != (int)lVar22);
            }
            iVar19 = iVar19 + 1;
          } while (iVar19 != local_54);
          iVar10 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>.y;
        }
        local_68 = local_68 + 1;
        if (iVar10 <= local_68) {
          return;
        }
      } while( true );
    }
  }
  else if (PVar3 == Half) {
    if (iVar19 <= iVar2) goto LAB_002af2d6;
    if (local_68 < iVar10) {
      TVar6 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
      uVar20 = TVar6.x;
      vb = iVar10;
      if ((int)((int)uVar20 >> 0x1f & uVar20) <= iVar2) {
        uVar17 = TVar6.y;
        if ((((int)((int)uVar17 >> 0x1f & uVar17) <= local_68) &&
            (iVar19 <= (int)(~((int)uVar20 >> 0x1f) & uVar20))) &&
           (iVar10 <= (int)(~((int)uVar17 >> 0x1f) & uVar17))) {
          do {
            if (0 < local_54) {
              pHVar4 = (this->p16).ptr;
              iVar16 = 0;
              iVar19 = (local_68 * uVar20 + iVar2) * iVar23;
              do {
                if (0 < iVar23) {
                  lVar22 = 0;
                  do {
                    uVar1 = pHVar4[iVar19 + lVar22].h;
                    uVar17 = (uint)uVar1 << 0xd;
                    if ((uVar17 & 0xf800000) == 0xf800000) {
                      fVar18 = (float)(uVar17 | 0x70000000);
                    }
                    else if ((uVar17 & 0xf800000) == 0) {
                      fVar18 = (float)(uVar17 | 0x38800000) + -6.1035156e-05;
                    }
                    else {
                      fVar18 = (float)((uVar17 & 0xfffe000) + 0x38000000);
                    }
                    lVar22 = lVar22 + 1;
                    *pfVar15 = (float)((int)(short)uVar1 & 0x80000000U | (uint)fVar18);
                    pfVar15 = pfVar15 + 1;
                  } while (iVar23 != (int)lVar22);
                  iVar19 = iVar19 + (int)lVar22;
                }
                iVar16 = iVar16 + 1;
              } while (iVar16 != local_54);
            }
            local_68 = local_68 + 1;
          } while (local_68 != iVar10);
          return;
        }
      }
      do {
        if (0 < local_54) {
          iVar19 = 0;
          do {
            va = CONCAT44(local_68,(extent->pMin).super_Tuple2<pbrt::Point2,_int>.x + iVar19);
            bVar9 = RemapPixelCoords((Point2i *)&va,
                                     (Point2i)(this->resolution).super_Tuple2<pbrt::Point2,_int>,
                                     (WrapMode2D)local_40.values);
            if (!bVar9) goto LAB_002af276;
            if (0 < iVar23) {
              iVar10 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
              sVar21 = (this->channelNames).nStored;
              lVar22 = 0;
              pHVar4 = (this->p16).ptr;
              do {
                uVar1 = pHVar4[((int)va + (int)(va >> 0x20) * iVar10) * (int)sVar21 + lVar22].h;
                uVar20 = (uint)uVar1 << 0xd;
                if ((uVar20 & 0xf800000) == 0xf800000) {
                  fVar18 = (float)(uVar20 | 0x70000000);
                }
                else if ((uVar20 & 0xf800000) == 0) {
                  fVar18 = (float)(uVar20 | 0x38800000) + -6.1035156e-05;
                }
                else {
                  fVar18 = (float)((uVar20 & 0xfffe000) + 0x38000000);
                }
                lVar22 = lVar22 + 1;
                *pfVar15 = (float)((int)(short)uVar1 & 0x80000000U | (uint)fVar18);
                pfVar15 = pfVar15 + 1;
              } while (iVar23 != (int)lVar22);
            }
            iVar19 = iVar19 + 1;
          } while (iVar19 != local_54);
          iVar10 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>.y;
        }
        local_68 = local_68 + 1;
        if (iVar10 <= local_68) {
          return;
        }
      } while( true );
    }
  }
  else {
    if (PVar3 != U256) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
               ,0x2c2,"Unhandled PixelFormat");
    }
    uVar20 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
    if ((int)((int)uVar20 >> 0x1f & uVar20) <= iVar2) {
      uVar17 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
      if ((((int)((int)uVar17 >> 0x1f & uVar17) <= local_68) &&
          (iVar19 <= (int)(~((int)uVar20 >> 0x1f) & uVar20))) &&
         (iVar10 <= (int)(~((int)uVar17 >> 0x1f) & uVar17))) {
        if (iVar10 <= local_68) {
          return;
        }
        sVar21 = (size_t)iVar16;
        do {
          uVar24 = (this->encoding).
                   super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   .bits;
          vin.ptr = (this->p8).ptr +
                    ((this->resolution).super_Tuple2<pbrt::Point2,_int>.x * local_68 +
                    (local_50->pMin).super_Tuple2<pbrt::Point2,_int>.x) *
                    (int)(this->channelNames).nStored;
          if (uVar24 < 0x2000000000000) {
            if (iVar16 != 0) {
              sVar11 = 0;
              do {
                pfVar15[sVar11] = (float)vin.ptr[sVar11] / 255.0;
                sVar11 = sVar11 + 1;
              } while (sVar21 != sVar11);
            }
          }
          else if ((uVar24 & 0xffff000000000000) == 0x2000000000000) {
            vout.n = sVar21;
            vout.ptr = pfVar15;
            vin.n = sVar21;
            sRGBColorEncoding::ToLinear((sRGBColorEncoding *)(uVar24 & 0xffffffffffff),vin,vout);
          }
          else {
            vout_00.n = sVar21;
            vout_00.ptr = pfVar15;
            vin_00.n = sVar21;
            vin_00.ptr = vin.ptr;
            GammaColorEncoding::ToLinear
                      ((GammaColorEncoding *)(uVar24 & 0xffffffffffff),vin_00,vout_00);
          }
          pfVar15 = pfVar15 + sVar21;
          local_68 = local_68 + 1;
        } while (local_68 < (local_50->pMax).super_Tuple2<pbrt::Point2,_int>.y);
        return;
      }
    }
    if (iVar19 <= iVar2) {
LAB_002af2d6:
      args_1 = "extent.pMax.x";
      args = "extent.pMin.x";
      iVar16 = 0x60;
      vb = iVar19;
      goto LAB_002af338;
    }
    va = CONCAT44(va._4_4_,local_68);
    if (local_68 < iVar10) {
      TVar6 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
      uVar20 = TVar6.x;
      vb = iVar10;
      if ((int)((int)uVar20 >> 0x1f & uVar20) <= iVar2) {
        uVar17 = TVar6.y;
        if ((((int)((int)uVar17 >> 0x1f & uVar17) <= local_68) &&
            (iVar19 <= (int)(~((int)uVar20 >> 0x1f) & uVar20))) &&
           (iVar10 <= (int)(~((int)uVar17 >> 0x1f) & uVar17))) {
          local_38 = uVar24;
          do {
            if (0 < local_54) {
              local_44 = 0;
              WVar13 = ((this->resolution).super_Tuple2<pbrt::Point2,_int>.x * local_68 +
                       (local_50->pMin).super_Tuple2<pbrt::Point2,_int>.x) *
                       (int)(this->channelNames).nStored;
              pBVar12 = local_50;
              do {
                if (0 < (int)uVar24) {
                  lVar22 = (long)(int)WVar13;
                  iVar19 = 0;
                  local_40.values[0] = WVar13;
                  do {
                    uVar14 = (this->encoding).
                             super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                             .bits;
                    vin_01.ptr = (this->p8).ptr + lVar22;
                    if (uVar14 < 0x2000000000000) {
                      *pfVar15 = (float)*vin_01.ptr / 255.0;
                    }
                    else if ((uVar14 & 0xffff000000000000) == 0x2000000000000) {
                      vout_01.n = 1;
                      vout_01.ptr = pfVar15;
                      vin_01.n = 1;
                      sRGBColorEncoding::ToLinear
                                ((sRGBColorEncoding *)(uVar14 & 0xffffffffffff),vin_01,vout_01);
                      uVar24 = local_38;
                    }
                    else {
                      vout_02.n = 1;
                      vout_02.ptr = pfVar15;
                      vin_02.n = 1;
                      vin_02.ptr = vin_01.ptr;
                      GammaColorEncoding::ToLinear
                                ((GammaColorEncoding *)(uVar14 & 0xffffffffffff),vin_02,vout_02);
                      uVar24 = local_38;
                    }
                    pfVar15 = pfVar15 + 1;
                    iVar19 = iVar19 + -1;
                    lVar22 = lVar22 + 1;
                  } while (-iVar23 != iVar19);
                  WVar13 = local_40.values[0] - iVar19;
                  pBVar12 = local_50;
                }
                local_44 = local_44 + 1;
              } while (local_44 != local_54);
              iVar10 = (pBVar12->pMax).super_Tuple2<pbrt::Point2,_int>.y;
            }
            local_68 = local_68 + 1;
          } while (local_68 < iVar10);
          return;
        }
      }
      do {
        if (0 < local_54) {
          iVar19 = 0;
          do {
            va = CONCAT44(local_68,(local_50->pMin).super_Tuple2<pbrt::Point2,_int>.x + iVar19);
            bVar9 = RemapPixelCoords((Point2i *)&va,
                                     (Point2i)(this->resolution).super_Tuple2<pbrt::Point2,_int>,
                                     (WrapMode2D)local_40.values);
            if (!bVar9) {
LAB_002af276:
              LogFatal<char_const(&)[51]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
                         ,0x72,"Check failed: %s",
                         (char (*) [51])"RemapPixelCoords(&p, image.Resolution(), wrapMode)");
            }
            local_44 = iVar19;
            if (0 < iVar23) {
              uVar14 = uVar24 & 0xffffffff;
              lVar22 = (long)(((int)va +
                              (int)(va >> 0x20) *
                              (this->resolution).super_Tuple2<pbrt::Point2,_int>.x) *
                             (int)(this->channelNames).nStored);
              do {
                uVar7 = (this->encoding).
                        super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                        .bits;
                vin_03.ptr = (this->p8).ptr + lVar22;
                if (uVar7 < 0x2000000000000) {
                  *pfVar15 = (float)*vin_03.ptr / 255.0;
                }
                else if ((uVar7 & 0xffff000000000000) == 0x2000000000000) {
                  vout_03.n = 1;
                  vout_03.ptr = pfVar15;
                  vin_03.n = 1;
                  sRGBColorEncoding::ToLinear
                            ((sRGBColorEncoding *)(uVar7 & 0xffffffffffff),vin_03,vout_03);
                }
                else {
                  vout_04.n = 1;
                  vout_04.ptr = pfVar15;
                  vin_04.n = 1;
                  vin_04.ptr = vin_03.ptr;
                  GammaColorEncoding::ToLinear
                            ((GammaColorEncoding *)(uVar7 & 0xffffffffffff),vin_04,vout_04);
                }
                pfVar15 = pfVar15 + 1;
                lVar22 = lVar22 + 1;
                uVar20 = (int)uVar14 - 1;
                uVar14 = (ulong)uVar20;
              } while (uVar20 != 0);
            }
            iVar19 = local_44 + 1;
          } while (iVar19 != local_54);
          iVar10 = (local_50->pMax).super_Tuple2<pbrt::Point2,_int>.y;
        }
        local_68 = local_68 + 1;
        if (iVar10 <= local_68) {
          return;
        }
      } while( true );
    }
  }
  args_1 = "extent.pMax.y";
  args = "extent.pMin.y";
  iVar16 = 0x61;
  vb = iVar10;
  iVar2 = local_68;
LAB_002af338:
  va = CONCAT44(va._4_4_,iVar2);
  LogFatal<char_const(&)[14],char_const(&)[14],char_const(&)[14],int&,char_const(&)[14],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
             ,iVar16,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [14])args,
             (char (*) [14])args_1,(char (*) [14])args,(int *)&va,(char (*) [14])args_1,&vb);
}

Assistant:

void Image::CopyRectOut(const Bounds2i &extent, pstd::span<float> buf,
                        WrapMode2D wrapMode) {
    CHECK_GE(buf.size(), extent.Area() * NChannels());

    auto bufIter = buf.begin();
    switch (format) {
    case PixelFormat::U256:
        if (Intersect(extent, Bounds2i({0, 0}, resolution)) == extent) {
            // All in bounds
            size_t count = NChannels() * (extent.pMax.x - extent.pMin.x);
            for (int y = extent.pMin.y; y < extent.pMax.y; ++y) {
                // Convert scanlines all at once.
                size_t offset = PixelOffset({extent.pMin.x, y});
#ifdef PBRT_FLOAT_AS_DOUBLE
                for (int i = 0; i < count; ++i) {
                    Float v;
                    encoding.ToLinear({&p8[offset + i], 1}, {&v, 1});
                    *bufIter++ = v;
                }
#else
                encoding.ToLinear({&p8[offset], count}, {&*bufIter, count});
#endif
                bufIter += count;
            }
        } else {
            ForExtent(extent, wrapMode, *this, [&bufIter, this](int offset) {
#ifdef PBRT_FLOAT_AS_DOUBLE
                Float v;
                encoding.ToLinear({&p8[offset], 1}, {&v, 1});
                *bufIter = v;
#else
                encoding.ToLinear({&p8[offset], 1}, {&*bufIter, 1});
#endif
                ++bufIter;
            });
        }
        break;

    case PixelFormat::Half:
        ForExtent(extent, wrapMode, *this,
                  [&bufIter, this](int offset) { *bufIter++ = Float(p16[offset]); });
        break;

    case PixelFormat::Float:
        ForExtent(extent, wrapMode, *this,
                  [&bufIter, this](int offset) { *bufIter++ = Float(p32[offset]); });
        break;

    default:
        LOG_FATAL("Unhandled PixelFormat");
    }
}